

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarTable.cpp
# Opt level: O3

string * rtrim(string *s)

{
  byte bVar1;
  pointer pcVar2;
  locale *plVar3;
  ctype *pcVar4;
  pointer pcVar5;
  size_type sVar6;
  long lVar7;
  pointer pcVar8;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  sVar6 = s->_M_string_length;
  pcVar8 = pcVar2 + sVar6;
  lVar7 = (long)sVar6 >> 2;
  if (0 < lVar7) {
    pcVar8 = pcVar8 + lVar7 * -4;
    lVar7 = lVar7 + 1;
    do {
      bVar1 = pcVar2[sVar6 - 1];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pcVar5 = pcVar2 + sVar6;
        goto LAB_00105f35;
      }
      bVar1 = pcVar2[sVar6 - 2];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pcVar5 = pcVar2 + (sVar6 - 1);
        goto LAB_00105f35;
      }
      bVar1 = pcVar2[sVar6 - 3];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pcVar5 = pcVar2 + (sVar6 - 2);
        goto LAB_00105f35;
      }
      bVar1 = pcVar2[sVar6 - 4];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
        pcVar5 = pcVar2 + (sVar6 - 3);
        goto LAB_00105f35;
      }
      sVar6 = sVar6 - 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = (long)pcVar8 - (long)pcVar2;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pcVar5 = pcVar2;
      if (lVar7 != 3) goto LAB_00105f35;
      bVar1 = pcVar8[-1];
      plVar3 = (locale *)std::locale::classic();
      pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
      pcVar5 = pcVar8;
      if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0)
      goto LAB_00105f35;
      pcVar8 = pcVar8 + -1;
    }
    bVar1 = pcVar8[-1];
    plVar3 = (locale *)std::locale::classic();
    pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
    pcVar5 = pcVar8;
    if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) goto LAB_00105f35;
    pcVar8 = pcVar8 + -1;
  }
  bVar1 = pcVar8[-1];
  plVar3 = (locale *)std::locale::classic();
  pcVar4 = std::use_facet<std::ctype<char>>(plVar3);
  pcVar5 = pcVar2;
  if ((*(byte *)(*(long *)(pcVar4 + 0x30) + 1 + (ulong)bVar1 * 2) & 0x20) == 0) {
    pcVar5 = pcVar8;
  }
LAB_00105f35:
  s->_M_string_length = (long)pcVar5 - (long)(s->_M_dataplus)._M_p;
  *pcVar5 = '\0';
  return s;
}

Assistant:

std::string &rtrim(std::string &s)
{
    auto it = std::find_if(s.rbegin(), s.rend(),
                           [](char c)
                           {
                               return !std::isspace<char>(c, std::locale::classic());
                           });
    s.erase(it.base(), s.end());
    return s;
}